

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrichtext.cpp
# Opt level: O1

int main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  Am_Constraint *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Rich_Text preamble_rt;
  Am_Object window;
  Am_Rich_Text local_70 [8];
  Am_Object local_68 [8];
  Am_Object local_60 [8];
  Am_Object local_58 [8];
  Am_Object local_50 [8];
  Am_Object local_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Object local_30 [8];
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  
  Am_Initialize();
  Am_Rich_Text::Am_Rich_Text
            (local_70,
             "We the people of the United States, in order to form a more perfect union, establish justice, insure domestic tranquility, provide for the common defense, promote the general welfare, and secure the blessings of liberty to ourselves and our posterity, do ordain and establish this Constitution for the United States of America."
            );
  Am_Object::Create((char *)local_20);
  uVar1 = Am_Object::Set((ushort)local_20,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,300);
  uVar1 = Am_Object::Set(uVar1,0x67,400);
  uVar2 = Am_Object::Set(uVar1,true,0);
  Am_Object::Create((char *)local_30);
  uVar1 = Am_Object::Set((ushort)local_30,0x65,0x31);
  uVar1 = Am_Object::Set(uVar1,100,0x31);
  uVar1 = Am_Object::Set(uVar1,0x67,0x98);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)box_width);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(local_28,pAVar5);
  uVar2 = Am_Object::Add_Part(uVar2,local_28,1,0);
  Am_Object::Create((char *)local_40);
  uVar1 = Am_Object::Set((ushort)local_40,0x65,0xf9);
  uVar1 = Am_Object::Set(uVar1,100,0x4a);
  uVar1 = Am_Object::Set(uVar1,0x67,0x66);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)box_width2);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(local_38,pAVar5);
  uVar2 = Am_Object::Add_Part(uVar2,local_38,1,0);
  Am_Object::Create((char *)local_50);
  uVar1 = Am_Object::Set((ushort)local_50,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x96);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)text_width);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar4 = Am_Rich_Text::operator_cast_to_Am_Wrapper_(local_70);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xab,(ulong)pAVar4);
  Am_Object::Am_Object(local_48,pAVar5);
  uVar2 = Am_Object::Add_Part(uVar2,local_48,1,0);
  Am_Object::Create((char *)local_60);
  uVar1 = Am_Object::Set((ushort)local_60,0x65,0xfa);
  uVar1 = Am_Object::Set(uVar1,100,0x4b);
  uVar1 = Am_Object::Set(uVar1,0x67,100);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)text_width2);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar4 = Am_Rich_Text::operator_cast_to_Am_Wrapper_(local_70);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xab,(ulong)pAVar4);
  Am_Object::Am_Object(local_58,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(uVar2,local_58,1,0);
  Am_Object::Am_Object(local_18,pAVar5);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(local_60);
  Am_Object::~Am_Object(local_48);
  Am_Object::~Am_Object(local_50);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(local_28);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(local_20);
  Am_Object::Am_Object(local_68,local_18);
  Am_Object::Add_Part(&Am_Screen,local_68,1,0);
  Am_Object::~Am_Object(local_68);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(local_18);
  Am_Rich_Text::~Am_Rich_Text(local_70);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Am_Rich_Text preamble_rt = Am_Rich_Text(preamble);

  Am_Object window = Am_Window.Create("window")
                         .Set(Am_TOP, 50)
                         .Set(Am_LEFT, 50)
                         .Set(Am_WIDTH, 300)
                         .Set(Am_HEIGHT, 400)
                         .Set(Am_DOUBLE_BUFFER, false)
                         .Add_Part(Am_Rectangle.Create()
                                       .Set(Am_TOP, 49)
                                       .Set(Am_LEFT, 49)
                                       .Set(Am_HEIGHT, 152)
                                       .Set(Am_WIDTH, box_width)
                                       .Set(Am_FILL_STYLE, Am_No_Style))
                         .Add_Part(Am_Rectangle.Create()
                                       .Set(Am_TOP, 249)
                                       .Set(Am_LEFT, 74)
                                       .Set(Am_HEIGHT, 102)
                                       .Set(Am_WIDTH, box_width2)
                                       .Set(Am_FILL_STYLE, Am_No_Style))
                         .Add_Part(Am_Text_Viewer.Create()
                                       .Set(Am_TOP, 50)
                                       .Set(Am_LEFT, 50)
                                       .Set(Am_HEIGHT, 150)
                                       .Set(Am_WIDTH, text_width)
                                       .Set(Am_TEXT, preamble_rt))
                         .Add_Part(Am_Text_Viewer.Create()
                                       .Set(Am_TOP, 250)
                                       .Set(Am_LEFT, 75)
                                       .Set(Am_HEIGHT, 100)
                                       .Set(Am_WIDTH, text_width2)
                                       .Set(Am_TEXT, preamble_rt));

  Am_Screen.Add_Part(window);

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}